

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O0

deBool deProcess_closeStdErr(deProcess *process)

{
  bool bVar1;
  deProcess *process_local;
  
  bVar1 = process->standardErr != (deFile *)0x0;
  if (bVar1) {
    deFile_destroy(process->standardErr);
    process->standardErr = (deFile *)0x0;
  }
  process_local._4_4_ = (uint)bVar1;
  return process_local._4_4_;
}

Assistant:

deBool deProcess_closeStdErr (deProcess* process)
{
	if (process->standardErr)
	{
		deFile_destroy(process->standardErr);
		process->standardErr = DE_NULL;
		return DE_TRUE;
	}
	else
		return DE_FALSE;
}